

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2cp.c
# Opt level: O0

_Bool i2cp_ringbuf_flush(i2cp_ringbuf *b,i2cp_buffer_visitor v,i2cp_state *st)

{
  undefined8 in_RDX;
  code *in_RSI;
  short *in_RDI;
  uint16_t idx;
  uint16_t sz;
  i2cp_msgbuf *msg;
  ushort local_2c;
  short local_2a;
  _Bool local_1;
  
  if (*in_RDI == 0) {
    local_1 = false;
  }
  else {
    local_2c = in_RDI[1];
    for (local_2a = *in_RDI; local_2a != 0; local_2a = local_2a + -1) {
      if (local_2c == 0) {
        local_2c = 0x1f;
      }
      else {
        local_2c = local_2c - 1;
      }
    }
    while (*in_RDI != 0) {
      (*in_RSI)(in_RDI + (ulong)local_2c * 0x8002 + 2 + 2,
                *(undefined4 *)(in_RDI + (ulong)local_2c * 0x8002 + 2),in_RDX);
      local_2c = (ushort)((ulong)(local_2c + 1) % 0x20);
      *in_RDI = *in_RDI + -1;
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool i2cp_ringbuf_flush(struct i2cp_ringbuf * b, i2cp_buffer_visitor v, struct i2cp_state * st)
{
  if(b->sz == 0) return false;
  struct i2cp_msgbuf * msg;
  uint16_t sz = b->sz;
  uint16_t idx = b->idx;
  while(sz)
  {
    if(idx)
      idx = idx - 1;
    else
      idx = RINGBUF_SZ - 1;
    sz--; 
  }
  while(b->sz)
  {
    msg = &b->buffs[idx];
    v(msg->buf, msg->sz, st);
    idx = (idx + 1) % RINGBUF_SZ;
    b->sz --;
  }
  return true;
}